

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-avl.c
# Opt level: O0

void pp_tree_avl_rotate_right(PTreeAVLNode *node,PTreeBaseNode **root)

{
  PTreeBaseNode **root_local;
  PTreeAVLNode *node_local;
  
  (node->parent->base).left = (node->base).right;
  if ((node->base).right != (PTreeBaseNode_ *)0x0) {
    (node->base).right[1].left = &node->parent->base;
  }
  (node->base).right = &node->parent->base;
  node->parent = (PTreeAVLNode_ *)(node->base).right[1].left;
  (node->base).right[1].left = &node->base;
  if (node->parent == (PTreeAVLNode_ *)0x0) {
    *root = &node->base;
  }
  else if ((node->parent->base).left == (node->base).right) {
    (node->parent->base).left = &node->base;
  }
  else {
    (node->parent->base).right = &node->base;
  }
  node->balance_factor = node->balance_factor + -1;
  *(pint *)&(node->base).right[1].right = -node->balance_factor;
  return;
}

Assistant:

static void
pp_tree_avl_rotate_right (PTreeAVLNode *node, PTreeBaseNode **root)
{
	node->parent->base.left = node->base.right;

	if (node->base.right != NULL)
		((PTreeAVLNode *) node->base.right)->parent = (PTreeAVLNode *) node->parent;

	node->base.right = (PTreeBaseNode *) node->parent;
	node->parent = ((PTreeAVLNode *) node->base.right)->parent;
	((PTreeAVLNode *) node->base.right)->parent = node;

	if (P_LIKELY (node->parent != NULL)) {
		if (node->parent->base.left == node->base.right)
			node->parent->base.left = (PTreeBaseNode *) node;
		else
			node->parent->base.right = (PTreeBaseNode *) node;
	} else
		*root = (PTreeBaseNode *) node;

	/* Restore balance factor */
	((PTreeAVLNode *) node)->balance_factor -= 1;
	((PTreeAVLNode *) node->base.right)->balance_factor = -((PTreeAVLNode *) node)->balance_factor;
}